

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
          (ImmutableMessageLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ClassNameResolver *pCVar4;
  FileDescriptor *pFVar5;
  FieldDescriptor *pFVar6;
  char *pcVar7;
  pointer ppVar8;
  LogMessage *pLVar9;
  int __c;
  LogMessage local_80;
  Voidify local_6d;
  int local_6c;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_68;
  OneofDescriptor *local_50;
  OneofDescriptor *oneof;
  int i;
  Voidify local_2d [13];
  Context *local_20;
  Context *context_local;
  Descriptor *descriptor_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (Descriptor *)this;
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageLiteGenerator_00ef8fb0;
  this->context_ = local_20;
  pCVar4 = Context::GetNameResolver(local_20);
  this->name_resolver_ = pCVar4;
  MakeImmutableFieldLiteGenerators(&this->field_generators_,(Descriptor *)context_local,local_20);
  oneof._7_1_ = 0;
  pFVar5 = Descriptor::file((Descriptor *)context_local);
  bVar2 = Context::EnforceLite(local_20);
  bVar2 = HasDescriptorMethods(pFVar5,bVar2);
  if (bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
               ,0x3b,"!HasDescriptorMethods(descriptor->file(), context->EnforceLite())");
    oneof._7_1_ = 1;
    pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&i);
    pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar9,(char (*) [89])
                               "Generator factory error: A lite message generator is used to generate non-lite messages."
                       );
    absl::lts_20250127::log_internal::Voidify::operator&&(local_2d,pLVar9);
  }
  if ((oneof._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i);
  }
  oneof._0_4_ = 0;
  do {
    uVar1 = (uint)oneof;
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar3 <= (int)uVar1) {
      return;
    }
    pFVar6 = Descriptor::field((this->super_MessageGenerator).descriptor_,(uint)oneof);
    bVar2 = IsRealOneof(pFVar6);
    if (bVar2) {
      pcVar7 = (char *)(ulong)(uint)oneof;
      pFVar6 = Descriptor::field((this->super_MessageGenerator).descriptor_,(uint)oneof);
      local_50 = FieldDescriptor::containing_oneof(pFVar6);
      pcVar7 = OneofDescriptor::index(local_50,pcVar7,__c);
      local_6c = (int)pcVar7;
      absl::lts_20250127::container_internal::
      btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
      ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                (&local_68,&(this->super_MessageGenerator).oneofs_,&local_6c,&local_50);
      ppVar8 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator->(&local_68.first);
      if (ppVar8->second != local_50) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
                   ,0x41,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
        pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_6d,pLVar9);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_80);
      }
    }
    oneof._0_4_ = (uint)oneof + 1;
  } while( true );
}

Assistant:

ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(MakeImmutableFieldLiteGenerators(descriptor, context)) {
  ABSL_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
}